

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O0

string * __thiscall
t_dart_generator::init_value_abi_cxx11_
          (string *__return_storage_ptr__,t_dart_generator *this,t_field *field)

{
  e_req eVar1;
  uint uVar2;
  t_base tVar3;
  allocator local_41;
  t_base tbase;
  t_type *ttype;
  allocator local_21;
  t_field *local_20;
  t_field *field_local;
  t_dart_generator *this_local;
  string *result;
  
  local_20 = field;
  field_local = (t_field *)this;
  this_local = (t_dart_generator *)__return_storage_ptr__;
  eVar1 = t_field::get_req(field);
  if (eVar1 == T_OPTIONAL) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  else {
    _tbase = (t_typedef *)t_field::get_type(local_20);
    uVar2 = (*(_tbase->super_t_type).super_t_doc._vptr_t_doc[9])();
    if ((uVar2 & 1) != 0) {
      _tbase = (t_typedef *)t_typedef::get_type(_tbase);
    }
    uVar2 = (*(_tbase->super_t_type).super_t_doc._vptr_t_doc[5])();
    if ((uVar2 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_41);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
    }
    else {
      tVar3 = t_base_type::get_base((t_base_type *)_tbase);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      switch(tVar3) {
      case TYPE_VOID:
      case TYPE_STRING:
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,"");
        break;
      case TYPE_BOOL:
        std::__cxx11::string::operator=((string *)__return_storage_ptr__," = false");
        break;
      case TYPE_I8:
      case TYPE_I16:
      case TYPE_I32:
      case TYPE_I64:
        std::__cxx11::string::operator=((string *)__return_storage_ptr__," = 0");
        break;
      case TYPE_DOUBLE:
        std::__cxx11::string::operator=((string *)__return_storage_ptr__," = 0.0");
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string t_dart_generator::init_value(t_field* field) {
  // Do not initialize optional fields
  if (field->get_req() == t_field::T_OPTIONAL) {
    return "";
  }

  t_type* ttype = field->get_type();

  // Get the actual type for a typedef
  if (ttype->is_typedef()) {
    ttype = ((t_typedef*)ttype)->get_type();
  }

  // Only consider base types for default initialization
  if (!ttype->is_base_type()) {
    return "";
  }
  t_base_type::t_base tbase = ((t_base_type*)ttype)->get_base();

  // Initialize bools, ints, and doubles with sane defaults
  string result;
  switch (tbase) {
  case t_base_type::TYPE_BOOL:
    result = " = false";
    break;
  case t_base_type::TYPE_I8:
  case t_base_type::TYPE_I16:
  case t_base_type::TYPE_I32:
  case t_base_type::TYPE_I64:
    result = " = 0";
    break;
  case t_base_type::TYPE_DOUBLE:
    result = " = 0.0";
    break;
  case t_base_type::TYPE_VOID:
  case t_base_type::TYPE_STRING:
    result = "";
    break;
  }

  return result;
}